

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O3

void __thiscall deqp::gles3::Functional::Framebuffer::~Framebuffer(Framebuffer *this)

{
  GLenum GVar1;
  long lVar2;
  deUint32 local_10;
  deUint32 local_c;
  
  (*this->m_context->_vptr_Context[0xb])(this->m_context,1,&this->m_framebuffer);
  GVar1 = (this->m_config).colorType;
  local_10 = this->m_colorBuffer;
  lVar2 = 0x40;
  if ((GVar1 != 0xde1) && (GVar1 != 0x8513)) {
    if (GVar1 != 0x8d41) goto LAB_006926ad;
    lVar2 = 0x70;
  }
  (**(code **)((long)this->m_context->_vptr_Context + lVar2))(this->m_context,1,&local_10);
LAB_006926ad:
  GVar1 = (this->m_config).depthStencilType;
  local_c = this->m_depthStencilBuffer;
  lVar2 = 0x40;
  if ((GVar1 != 0xde1) && (GVar1 != 0x8513)) {
    if (GVar1 != 0x8d41) {
      return;
    }
    lVar2 = 0x70;
  }
  (**(code **)((long)this->m_context->_vptr_Context + lVar2))(this->m_context,1,&local_c);
  return;
}

Assistant:

Framebuffer::~Framebuffer (void)
{
	m_context.deleteFramebuffers(1, &m_framebuffer);
	destroyBuffer(m_colorBuffer, m_config.colorType);
	destroyBuffer(m_depthStencilBuffer, m_config.depthStencilType);
}